

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

DVector2 FindRefPoint(line_t *ld,DVector2 *pos)

{
  sector_t *psVar1;
  sector_t *psVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double *in_RDI;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  psVar1 = ld->frontsector;
  dVar8 = (psVar1->floorplane).normal.X;
  if ((((dVar8 == 0.0) && (!NAN(dVar8))) && (dVar8 = (psVar1->floorplane).normal.Y, dVar8 == 0.0))
     && (!NAN(dVar8))) {
    psVar2 = ld->backsector;
    dVar8 = (psVar2->floorplane).normal.X;
    if ((((((dVar8 == 0.0) && (!NAN(dVar8))) &&
          ((dVar8 = (psVar2->floorplane).normal.Y, dVar8 == 0.0 &&
           ((!NAN(dVar8) && (dVar8 = (psVar1->ceilingplane).normal.X, dVar8 == 0.0)))))) &&
         (!NAN(dVar8))) &&
        ((((dVar8 = (psVar1->ceilingplane).normal.Y, dVar8 == 0.0 && (!NAN(dVar8))) &&
          (dVar8 = (psVar2->ceilingplane).normal.X, dVar8 == 0.0)) &&
         ((!NAN(dVar8) && (dVar8 = (psVar2->ceilingplane).normal.Y, dVar8 == 0.0)))))) &&
       (((!NAN(dVar8) &&
         (((psVar2->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0 &&
          ((psVar1->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0)))) &&
        (((psVar1->planes[1].Flags & 0x1d0U) != 0x100 &&
         ((psVar1->planes[0].Flags & 0x1d0U) != 0x100)))))) {
      dVar8 = pos->X;
      dVar9 = pos->Y;
      goto LAB_0041d61a;
    }
  }
  dVar8 = (ld->v1->p).X;
  dVar9 = (ld->v1->p).Y;
  dVar4 = (ld->delta).X;
  dVar5 = (ld->delta).Y;
  dVar6 = ((pos->X - dVar8) * dVar4 + dVar5 * (pos->Y - dVar9)) / (dVar5 * dVar5 + dVar4 * dVar4);
  dVar7 = 1.0;
  if (dVar6 <= 1.0) {
    dVar7 = dVar6;
  }
  dVar7 = (double)(-(ulong)(0.0 < dVar6) & (ulong)dVar7);
  dVar8 = dVar7 * dVar4 + dVar8;
  dVar9 = dVar7 * dVar5 + dVar9;
LAB_0041d61a:
  *in_RDI = dVar8;
  in_RDI[1] = dVar9;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar8;
  return (DVector2)(auVar3 << 0x40);
}

Assistant:

static DVector2 FindRefPoint(line_t *ld, const DVector2 &pos)
{
	// If there's any chance of slopes getting in the way we need to get a proper refpoint, otherwise we can save the work.
	// Slopes can get in here when:
	// - the actual sector planes are sloped
	// - there's 3D floors in this sector
	// - there's a crossable floor portal (for which the dropoff needs to be calculated within P_LineOpening, and the lower sector can easily have slopes)
	//
	// Todo: check if this bootload of checks even helps or if it adds more than it saves
	//
	if 	(ld->frontsector->floorplane.isSlope() ||
			ld->backsector->floorplane.isSlope() ||
			ld->frontsector->ceilingplane.isSlope() ||
			ld->backsector->ceilingplane. isSlope() ||
			ld->backsector->e->XFloor.ffloors.Size() != 0 ||
			ld->frontsector->e->XFloor.ffloors.Size() != 0 ||
			!ld->frontsector->PortalBlocksMovement(sector_t::ceiling) ||
			!ld->frontsector->PortalBlocksMovement(sector_t::floor))
	{

		DVector2 v1 = ld->v1->fPos();
		DVector2 d = ld->Delta();
		double r = clamp(((pos.X - v1.X) * d.X + (pos.Y - v1.Y) * d.Y) / (d.X*d.X + d.Y*d.Y), 0., 1.);
		return v1 + d*r;
	}
	return pos;
}